

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall
aim_t::EnterSectorPortal
          (aim_t *this,int position,double frac,sector_t *entersec,DAngle *newtoppitch,
          DAngle *newbottompitch)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char *pcVar4;
  char *pcVar5;
  subsector_t *psVar6;
  aim_t cloned;
  undefined1 local_148 [248];
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  bool local_2f;
  
  dVar1 = sectorPortals.Array[entersec->Portals[position]].mPlaneZ;
  if (((position != 1) || (this->limitz <= dVar1)) && ((position != 0 || (dVar1 <= this->limitz))))
  {
    local_40 = (this->aimtrace).Y;
    local_148._48_8_ = this->aimtarget;
    local_148._0_8_ = (this->aimpitch).Degrees;
    local_148._8_8_ = this->attackrange;
    local_148._32_8_ = this->shootthing;
    local_148._40_8_ = this->friender;
    local_148._16_8_ = this->shootz;
    local_2f = this->unlinked;
    local_148._192_4_ = this->flags;
    local_148._56_8_ = newtoppitch->Degrees;
    local_148._64_8_ = newbottompitch->Degrees;
    local_148._224_4_ = (position != 1) + 1;
    local_50 = (this->startpos).Z;
    dStack_48 = (this->aimtrace).X;
    dVar2 = (this->startpos).X + sectorPortals.Array[entersec->Portals[position]].mDisplacement.X;
    dVar3 = (this->startpos).Y + sectorPortals.Array[entersec->Portals[position]].mDisplacement.Y;
    local_148._240_4_ = SUB84(dVar3,0);
    local_148._232_8_ = dVar2;
    local_148._244_4_ = (int)((ulong)dVar3 >> 0x20);
    local_38 = 1.0 / (double)local_148._8_8_ + frac;
    psVar6 = P_PointInSubsector(dStack_48 * local_38 + dVar2,dVar3 + local_38 * local_40);
    local_148._200_8_ = psVar6->sector;
    pcVar5 = "Alphaceiling";
    local_148._24_8_ = dVar1;
    if (aimdebug.Value == true) {
      pcVar4 = "Alphaceiling";
      if (position == 0) {
        pcVar4 = "Alphafloor";
      }
      Printf("-----Entering %s portal from sector %d to sector %d\n",pcVar4 + 5,
             (ulong)(uint)this->lastsector->sectornum,
             (ulong)(uint)((sector_t *)local_148._200_8_)->sectornum);
    }
    AimTraverse((aim_t *)local_148);
    if ((double)local_148._104_8_ < (this->linetarget).frac) {
      (this->linetarget).super_FTranslatedLineTarget.linetarget = (AActor *)local_148._72_8_;
      (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees =
           (double)local_148._80_8_;
      (this->linetarget).super_FTranslatedLineTarget.unlinked = local_148[0x58];
      (this->linetarget).pitch.Degrees = (double)local_148._96_8_;
      (this->linetarget).frac = (double)local_148._104_8_;
    }
    if ((double)local_148._144_8_ < (this->thing_friend).frac) {
      (this->thing_friend).super_FTranslatedLineTarget.linetarget = (AActor *)local_148._112_8_;
      (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees =
           (double)local_148._120_8_;
      (this->thing_friend).super_FTranslatedLineTarget.unlinked = local_148[0x80];
      (this->thing_friend).pitch.Degrees = (double)local_148._136_8_;
      (this->thing_friend).frac = (double)local_148._144_8_;
    }
    if ((double)local_148._184_8_ < (this->thing_other).frac) {
      (this->thing_other).super_FTranslatedLineTarget.linetarget = (AActor *)local_148._152_8_;
      (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees =
           (double)local_148._160_8_;
      (this->thing_other).super_FTranslatedLineTarget.unlinked = local_148[0xa8];
      (this->thing_other).pitch.Degrees = (double)local_148._176_8_;
      (this->thing_other).frac = (double)local_148._184_8_;
    }
    if (aimdebug.Value == true) {
      if (position == 0) {
        pcVar5 = "Alphafloor";
      }
      Printf("-----Exiting %s portal\n",pcVar5 + 5);
    }
  }
  return;
}

Assistant:

void EnterSectorPortal(int position, double frac, sector_t *entersec, DAngle newtoppitch, DAngle newbottompitch)
	{
		double portalz = entersec->GetPortalPlaneZ(position);

		if (position == sector_t::ceiling && portalz < limitz) return;
		else if (position == sector_t::floor && portalz > limitz) return;
		aim_t newtrace = Clone();


		newtrace.toppitch = newtoppitch;
		newtrace.bottompitch = newbottompitch;
		newtrace.aimdir = position == sector_t::ceiling? aim_t::aim_up : aim_t::aim_down;
		newtrace.startpos = startpos + entersec->GetPortalDisplacement(position);
		newtrace.startfrac = frac + 1. / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening
		newtrace.lastsector = P_PointInSector(newtrace.startpos + aimtrace * newtrace.startfrac);
		newtrace.limitz = portalz;
		if (aimdebug)
			Printf("-----Entering %s portal from sector %d to sector %d\n", position ? "ceiling" : "floor", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
		if (aimdebug)
			Printf("-----Exiting %s portal\n", position ? "ceiling" : "floor");
	}